

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

dgBigVector * __thiscall
dgMeshEffect::GetOrigin(dgBigVector *__return_storage_ptr__,dgMeshEffect *this)

{
  int iVar1;
  dgBigVector *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = *(int *)&(this->super_dgRefCounter).field_0xc;
  if ((long)iVar1 < 1) {
    dVar6 = 0.0;
    dVar5 = 0.0;
    dVar4 = 0.0;
  }
  else {
    pdVar2 = this->m_points;
    dVar4 = 0.0;
    lVar3 = 0;
    dVar5 = 0.0;
    dVar6 = 0.0;
    do {
      dVar6 = dVar6 + *(double *)((long)&(pdVar2->super_dgTemplateVector<double>).m_x + lVar3);
      dVar5 = dVar5 + *(double *)((long)&(pdVar2->super_dgTemplateVector<double>).m_y + lVar3);
      dVar4 = dVar4 + *(double *)((long)&(pdVar2->super_dgTemplateVector<double>).m_z + lVar3);
      lVar3 = lVar3 + 0x20;
    } while ((long)iVar1 << 5 != lVar3);
  }
  dVar7 = 1.0 / (double)iVar1;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar6 * dVar7;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = dVar5 * dVar7;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar4 * dVar7;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_w = 0.0;
  if ((((long)ABS(dVar6 * dVar7) < 0x7ff0000000000000) &&
      ((long)ABS(dVar5 * dVar7) < 0x7ff0000000000000)) &&
     ((long)ABS(dVar4 * dVar7) < 0x7ff0000000000000)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

dgBigVector dgMeshEffect::GetOrigin ()const
{
	dgBigVector origin (hacd::HaF64 (0.0f), hacd::HaF64 (0.0f), hacd::HaF64 (0.0f), hacd::HaF64 (0.0f));	
	for (hacd::HaI32 i = 0; i < m_pointCount; i ++) {
		origin += m_points[i];
	}	
	return origin.Scale (hacd::HaF64 (1.0f) / m_pointCount);
}